

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

bool __thiscall
andres::
BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
::overlaps<float,false,std::allocator<unsigned_long>>
          (BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
           *this,View<float,_false,_std::allocator<unsigned_long>_> *v)

{
  View<float,_true,_std::allocator<unsigned_long>_> *pVVar1;
  pointer pfVar2;
  pointer pfVar3;
  bool bVar4;
  reference pfVar5;
  reference pfVar6;
  void *dataPointer_;
  void *vDataPointer_;
  void *dataPointer__1;
  
  pVVar1 = *(View<float,_true,_std::allocator<unsigned_long>_> **)this;
  View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  pfVar2 = pVVar1->data_;
  if ((pfVar2 != (pointer)0x0) && (pfVar3 = v->data_, pfVar3 != (pointer)0x0)) {
    pfVar5 = View<float,_true,_std::allocator<unsigned_long>_>::operator()
                       (pVVar1,(pVVar1->geometry_).size_ - 1);
    pfVar6 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((pfVar2 <= pfVar3) && (pfVar3 <= pfVar5)) {
      return true;
    }
    if ((pfVar3 <= pfVar2) && (pfVar2 <= pfVar6)) {
      return true;
    }
  }
  pVVar1 = *(View<float,_true,_std::allocator<unsigned_long>_> **)(this + 8);
  View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
  View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  pfVar2 = pVVar1->data_;
  if ((pfVar2 == (pointer)0x0) || (pfVar3 = v->data_, pfVar3 == (pointer)0x0)) {
    bVar4 = false;
  }
  else {
    pfVar5 = View<float,_true,_std::allocator<unsigned_long>_>::operator()
                       (pVVar1,(pVVar1->geometry_).size_ - 1);
    pfVar6 = View<float,_false,_std::allocator<unsigned_long>_>::operator()
                       (v,(v->geometry_).size_ - 1);
    if ((pfVar3 < pfVar2) || (pfVar5 < pfVar3)) {
      if (pfVar2 < pfVar3) {
        return false;
      }
      if (pfVar6 < pfVar2) {
        return false;
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e1_.overlaps(v) || e2_.overlaps(v); }